

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O3

void la_miam_bitmask_format_text(la_vstring *vstr,uint8_t bitmask,la_dict *dict,int indent)

{
  void *pvVar1;
  undefined7 in_register_00000031;
  int i;
  uint id;
  
  id = 0;
  do {
    if (((uint)CONCAT71(in_register_00000031,bitmask) >> (id & 0x1f) & 1) != 0) {
      pvVar1 = la_dict_search(dict,id);
      if (pvVar1 == (void *)0x0) {
        la_vstring_append_sprintf
                  (vstr,"%*sunknown (%u)\n",(ulong)(uint)indent,"",
                   (ulong)(uint)(1 << ((byte)id & 0x1f)));
      }
      else {
        la_vstring_append_sprintf(vstr,"%*s%s\n",(ulong)(uint)indent,"",pvVar1);
      }
    }
    id = id + 1;
  } while (id != 8);
  return;
}

Assistant:

static void la_miam_bitmask_format_text(la_vstring *vstr, uint8_t bitmask,
		la_dict const *dict, int indent) {
	la_assert(vstr != NULL);
	la_assert(dict != NULL);
	la_assert(indent >= 0);

	for(int i = 0; i < 8; i++) {
		if((bitmask & (1 << i)) != 0) {
			char *name = la_dict_search(dict, i);
			if(name != NULL) {
				LA_ISPRINTF(vstr, indent, "%s\n", name);
			} else {
				LA_ISPRINTF(vstr, indent, "unknown (%u)\n", 1 << i);
			}
		}
	}
}